

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifsit(bifcxdef *ctx,int argc)

{
  long lVar1;
  long lVar2;
  uchar **p;
  int iVar3;
  int iVar4;
  int in_ESI;
  long in_RDI;
  int cnt;
  uint siz;
  uchar *lst;
  voccxdef *vcx;
  int typ;
  objnum obj;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  runcxdef *in_stack_ffffffffffffffb0;
  uchar **lstp;
  undefined4 local_30;
  undefined2 local_e;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x70);
  if (in_ESI == 2) {
    if (*(char *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + -0x10) == '\x05') {
      *(long *)(*(long *)(in_RDI + 8) + 0x20) = *(long *)(*(long *)(in_RDI + 8) + 0x20) + -0x10;
      local_e = 0xffff;
    }
    else {
      lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
      *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
      if (*(char *)(lVar2 + -0x10) != '\x02') {
        *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
        runsign(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      }
      local_e = *(undefined2 *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    }
    lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
    if (*(char *)(lVar2 + -0x10) != '\x01') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    }
    iVar3 = (int)*(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    *(undefined2 *)(lVar1 + 0xf4e) = 0;
    if (iVar3 == 0) {
      *(undefined2 *)(lVar1 + 0xf48) = local_e;
    }
    else if (iVar3 == 1) {
      *(undefined2 *)(lVar1 + 0xf4a) = local_e;
    }
    else if (iVar3 == 2) {
      *(undefined2 *)(lVar1 + 0xf4c) = local_e;
    }
  }
  else if (*(char *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + -0x10) == '\a') {
    lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
    if (*(char *)(lVar2 + -0x10) != '\a') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    }
    p = *(uchar ***)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    lstp = p;
    iVar3 = osrp2(p);
    local_30 = 0;
    while (iVar3 != 2) {
      if (*(char *)((long)p + 2) == '\x02') {
        iVar4 = osrp2((void *)((long)p + 3));
        *(short *)(lVar1 + 0xf50 + (long)local_30 * 2) = (short)iVar4;
        local_30 = local_30 + 1;
      }
      lstadv(lstp,(uint *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    *(short *)(lVar1 + 0xf4e) = (short)local_30;
    *(undefined2 *)(lVar1 + 0xf48) = 0xffff;
  }
  else {
    if (*(char *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + -0x10) == '\x05') {
      *(undefined2 *)(lVar1 + 0xf48) = 0xffff;
      *(long *)(*(long *)(in_RDI + 8) + 0x20) = *(long *)(*(long *)(in_RDI + 8) + 0x20) + -0x10;
    }
    else {
      lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
      *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
      if (*(char *)(lVar2 + -0x10) != '\x02') {
        *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
        runsign(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      }
      *(undefined2 *)(lVar1 + 0xf48) = *(undefined2 *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    }
    *(undefined2 *)(lVar1 + 0xf4e) = 0;
  }
  return;
}

Assistant:

void bifsit(bifcxdef *ctx, int argc)
{
    objnum    obj;
    int       typ;
    voccxdef *vcx = ctx->bifcxrun->runcxvoc;
    
    /* check for extended version that allows setting him/her */
    if (argc == 2)
    {
        if (runtostyp(ctx->bifcxrun) == DAT_NIL)
        {
            rundisc(ctx->bifcxrun);                      /* discard the nil */
            obj = MCMONINV;                           /* use invalid object */
        }
        else
            obj = runpopobj(ctx->bifcxrun);               /* get the object */

        typ = runpopnum(ctx->bifcxrun);                     /* get the code */
        vcx->voccxthc = 0;                         /* clear the 'them' list */

        switch(typ)
        {
        case 0:                                                 /* set "it" */
            vcx->voccxit = obj;
            break;

        case 1:                                                /* set "him" */
            vcx->voccxhim = obj;
            break;

        case 2:                                                /* set "her" */
            vcx->voccxher = obj;
            break;
        }
        return;
    }

    /* "setit classic" has one argument only */
    bifcntargs(ctx, 1, argc);

    /* check to see if we're setting 'it' or 'them' */
    if (runtostyp(ctx->bifcxrun) == DAT_LIST)
    {
        uchar *lst;
        uint   siz;
        int    cnt;

        lst = runpoplst(ctx->bifcxrun);
        siz = osrp2(lst);
        lst += 2;
        siz -= 2;

        for (cnt = 0 ; siz ; )
        {
            /* if this is an object, add to 'them' list (otherwise ignore) */
            if (*lst == DAT_OBJECT)
                vcx->voccxthm[cnt++] = osrp2(lst+1);

            lstadv(&lst, &siz);
        }
        vcx->voccxthc = cnt;
        vcx->voccxit = MCMONINV;
    }
    else
    {
        /* set 'it', and delete 'them' list */
        if (runtostyp(ctx->bifcxrun) == DAT_NIL)
        {
            vcx->voccxit = MCMONINV;
            rundisc(ctx->bifcxrun);
        }
        else
            vcx->voccxit = runpopobj(ctx->bifcxrun);
        vcx->voccxthc = 0;
    }
}